

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void __thiscall
vkb::detail::SurfaceSupportErrorCategory::~SurfaceSupportErrorCategory
          (SurfaceSupportErrorCategory *this)

{
  std::_V2::error_category::~error_category(&this->super_error_category);
  operator_delete(this,8);
  return;
}

Assistant:

std::string message(int err) const override {
        switch (static_cast<SurfaceSupportError>(err)) {
            CASE_TO_STRING(SurfaceSupportError, surface_handle_null)
            CASE_TO_STRING(SurfaceSupportError, failed_get_surface_capabilities)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_surface_formats)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_present_modes)
            CASE_TO_STRING(SurfaceSupportError, no_suitable_desired_format)
            default:
                return "";
        }
    }